

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::ResetToBuiltinUTC(TimeZoneInfo *this,seconds *offset)

{
  rep rVar1;
  seconds *extraout_RDX;
  civil_time<absl::time_internal::cctz::detail::second_tag> a;
  duration<long,_std::ratio<1L,_1L>_> local_180;
  undefined1 local_178 [32];
  duration<long,_std::ratio<1L,_1L>_> local_158;
  size_type local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string local_130;
  detail *local_110;
  int_least64_t local_108;
  fields local_100;
  absolute_lookup local_f0;
  __normal_iterator<absl::time_internal::cctz::Transition_*,_std::vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>_>
  local_d0;
  const_iterator local_c8;
  __normal_iterator<absl::time_internal::cctz::Transition_*,_std::vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>_>
  local_c0;
  reference local_b8;
  Transition *tr;
  int_fast64_t unix_time;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<long_long> local_38;
  initializer_list<long_long> *local_28;
  initializer_list<long_long> *__range2;
  TransitionType *tt;
  seconds *offset_local;
  TimeZoneInfo *this_local;
  seconds *offset_00;
  
  tt = (TransitionType *)offset;
  offset_local = (seconds *)this;
  std::
  vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
  ::resize(&this->transition_types_,1);
  __range2 = (initializer_list<long_long> *)
             std::
             vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
             ::back(&this->transition_types_);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)tt);
  *(int *)&__range2->_M_array = (int)rVar1;
  *(undefined1 *)&__range2[2]._M_len = 0;
  *(undefined1 *)((long)&__range2[2]._M_len + 1) = 0;
  std::
  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  ::clear(&this->transitions_);
  std::
  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  ::reserve(&this->transitions_,0xc);
  memcpy(&__begin2,&DAT_001fbe60,0x60);
  local_38._M_array = (iterator)&__begin2;
  local_38._M_len = 0xc;
  local_28 = &local_38;
  __end2 = std::initializer_list<long_long>::begin(local_28);
  unix_time = (int_fast64_t)std::initializer_list<long_long>::end(local_28);
  offset_00 = extraout_RDX;
  for (; __end2 != (const_iterator)unix_time; __end2 = __end2 + 1) {
    tr = (Transition *)*__end2;
    local_d0._M_current =
         (Transition *)
         std::
         vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
         ::end(&this->transitions_);
    __gnu_cxx::
    __normal_iterator<absl::time_internal::cctz::Transition_const*,std::vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>>
    ::__normal_iterator<absl::time_internal::cctz::Transition*>
              ((__normal_iterator<absl::time_internal::cctz::Transition_const*,std::vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>>
                *)&local_c8,&local_d0);
    local_c0._M_current =
         (Transition *)
         std::
         vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
         ::emplace<>(&this->transitions_,local_c8);
    local_b8 = __gnu_cxx::
               __normal_iterator<absl::time_internal::cctz::Transition_*,_std::vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>_>
               ::operator*(&local_c0);
    local_b8->unix_time = (int_least64_t)tr;
    local_b8->type_index = '\0';
    LocalTime(&local_f0,this,local_b8->unix_time,(TransitionType *)__range2);
    (local_b8->civil_sec).f_.y = local_f0.cs.f_.y;
    (local_b8->civil_sec).f_.m = local_f0.cs.f_.m;
    (local_b8->civil_sec).f_.d = local_f0.cs.f_.d;
    (local_b8->civil_sec).f_.hh = local_f0.cs.f_.hh;
    (local_b8->civil_sec).f_.mm = local_f0.cs.f_.mm;
    (local_b8->civil_sec).f_.ss = local_f0.cs.f_.ss;
    *(undefined3 *)&(local_b8->civil_sec).f_.field_0xd = local_f0.cs.f_._13_3_;
    local_110 = (detail *)(local_b8->civil_sec).f_.y;
    local_108._0_1_ = (local_b8->civil_sec).f_.m;
    local_108._1_1_ = (local_b8->civil_sec).f_.d;
    local_108._2_1_ = (local_b8->civil_sec).f_.hh;
    local_108._3_1_ = (local_b8->civil_sec).f_.mm;
    local_108._4_1_ = (local_b8->civil_sec).f_.ss;
    local_108._5_3_ = *(undefined3 *)&(local_b8->civil_sec).f_.field_0xd;
    a.f_.m = '\x01';
    a.f_.d = '\0';
    a.f_.hh = '\0';
    a.f_.mm = '\0';
    a.f_.ss = '\0';
    a.f_._13_3_ = 0;
    a.f_.y = local_108;
    local_100 = (fields)detail::operator-(local_110,a,(diff_t)local_110);
    offset_00 = local_100._8_8_;
    (local_b8->prev_civil_sec).f_.y = local_100.y;
    *(seconds **)&(local_b8->prev_civil_sec).f_.m = offset_00;
  }
  this->default_transition_type_ = '\0';
  FixedOffsetToAbbr_abi_cxx11_(&local_130,(cctz *)tt,offset_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::append((ulong)&this->abbreviations_,'\x01');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1dd5ec);
  this->extended_ = false;
  local_158 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::max();
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_158);
  LocalTime((absolute_lookup *)&local_150,this,rVar1,(TransitionType *)__range2);
  __range2->_M_len = local_150;
  __range2[1]._M_array = (iterator)in_stack_fffffffffffffeb8;
  local_180 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::min();
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_180);
  LocalTime((absolute_lookup *)local_178,this,rVar1,(TransitionType *)__range2);
  __range2[1]._M_len = local_178._0_8_;
  __range2[2]._M_array = (iterator)local_178._8_8_;
  std::
  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  ::shrink_to_fit(&this->transitions_);
  return true;
}

Assistant:

bool TimeZoneInfo::ResetToBuiltinUTC(const seconds& offset) {
  transition_types_.resize(1);
  TransitionType& tt(transition_types_.back());
  tt.utc_offset = static_cast<std::int_least32_t>(offset.count());
  tt.is_dst = false;
  tt.abbr_index = 0;

  // We temporarily add some redundant, contemporary (2015 through 2025)
  // transitions for performance reasons.  See TimeZoneInfo::LocalTime().
  // TODO: Fix the performance issue and remove the extra transitions.
  transitions_.clear();
  transitions_.reserve(12);
  for (const std::int_fast64_t unix_time : {
           -(1LL << 59),  // a "first half" transition
           1420070400LL,  // 2015-01-01T00:00:00+00:00
           1451606400LL,  // 2016-01-01T00:00:00+00:00
           1483228800LL,  // 2017-01-01T00:00:00+00:00
           1514764800LL,  // 2018-01-01T00:00:00+00:00
           1546300800LL,  // 2019-01-01T00:00:00+00:00
           1577836800LL,  // 2020-01-01T00:00:00+00:00
           1609459200LL,  // 2021-01-01T00:00:00+00:00
           1640995200LL,  // 2022-01-01T00:00:00+00:00
           1672531200LL,  // 2023-01-01T00:00:00+00:00
           1704067200LL,  // 2024-01-01T00:00:00+00:00
           1735689600LL,  // 2025-01-01T00:00:00+00:00
       }) {
    Transition& tr(*transitions_.emplace(transitions_.end()));
    tr.unix_time = unix_time;
    tr.type_index = 0;
    tr.civil_sec = LocalTime(tr.unix_time, tt).cs;
    tr.prev_civil_sec = tr.civil_sec - 1;
  }

  default_transition_type_ = 0;
  abbreviations_ = FixedOffsetToAbbr(offset);
  abbreviations_.append(1, '\0');
  future_spec_.clear();  // never needed for a fixed-offset zone
  extended_ = false;

  tt.civil_max = LocalTime(seconds::max().count(), tt).cs;
  tt.civil_min = LocalTime(seconds::min().count(), tt).cs;

  transitions_.shrink_to_fit();
  return true;
}